

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketMath.h
# Opt level: O2

void Eigen::internal::
     assign_innervec_CompleteUnrolling<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_10,_16>
     ::run(Matrix<double,_4,_4,_0,_4,_4> *dst,
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
          *src)

{
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  CVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  CVar1 = *src;
  auVar2._8_4_ = CVar1.m_functor.m_other._0_4_;
  auVar2._0_8_ = CVar1.m_functor.m_other.m_other;
  auVar2._12_4_ = CVar1.m_functor.m_other._4_4_;
  *(undefined1 (*) [16])
   ((dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 10)
       = auVar2;
  CVar1 = *src;
  auVar3._8_4_ = CVar1.m_functor.m_other._0_4_;
  auVar3._0_8_ = CVar1.m_functor.m_other.m_other;
  auVar3._12_4_ = CVar1.m_functor.m_other._4_4_;
  *(undefined1 (*) [16])
   ((dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 0xc
   ) = auVar3;
  CVar1 = *src;
  auVar4._8_4_ = CVar1.m_functor.m_other._0_4_;
  auVar4._0_8_ = CVar1.m_functor.m_other.m_other;
  auVar4._12_4_ = CVar1.m_functor.m_other._4_4_;
  *(undefined1 (*) [16])
   ((dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 0xe
   ) = auVar4;
  return;
}

Assistant:

EIGEN_STRONG_INLINE Packet2d pset1<Packet2d>(const double& from) { return _mm_set1_pd(from); }